

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

bool RigidBodyDynamics::isConstrainedSystemFullyActuated
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  int iVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  long in_RCX;
  FullPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RSI;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_R9;
  bool isCompatible;
  uint r;
  uint nu;
  uint na;
  uint nc;
  uint n;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffff28;
  FullPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff9f;
  ConstraintSet *in_stack_ffffffffffffffa0;
  VectorNd *in_stack_ffffffffffffffa8;
  VectorNd *in_stack_ffffffffffffffb0;
  VectorNd *in_stack_ffffffffffffffb8;
  
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6df93f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RCX + 0x20));
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6df972);
  iVar1 = (int)IVar4;
  iVar2 = (int)IVar3 - iVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6df9bc);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_ffffffffffffff38);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  CalcConstrainedSystemVariables
            ((Model *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_R9);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6dfa30);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_R9);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffff30,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)in_R9);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff30,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_R9);
  Eigen::FullPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_ffffffffffffff30,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_R9
            );
  IVar4 = Eigen::FullPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rank(in_RSI);
  return (int)IVar4 == (int)IVar3 - iVar1;
}

Assistant:

RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 update_kinematics, f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}